

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O2

int secp256k1_bulletproof_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,uchar **proof,
              size_t n_proofs,size_t plen,size_t nbits,uint64_t **min_value,secp256k1_ge **commitp,
              size_t n_commits,secp256k1_ge *value_gen,secp256k1_bulletproof_generators *gens,
              uchar **extra_commit,size_t *extra_commit_len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint64_t *puVar6;
  secp256k1_scalar *psVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong n;
  size_t sVar13;
  uint64_t *r_00;
  uchar *puVar14;
  secp256k1_ge *psVar15;
  uint64_t uVar16;
  size_t sVar17;
  uchar *puVar18;
  long lVar19;
  void *pvVar20;
  long lVar21;
  secp256k1_scalar *psVar22;
  uchar *puVar23;
  secp256k1_scalar *psVar24;
  secp256k1_scalar *psVar25;
  ulong uVar26;
  ulong uVar27;
  secp256k1_scratch *scratch_00;
  bool bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  uchar len [4];
  byte local_311;
  secp256k1_scratch *local_310;
  size_t local_308;
  uint64_t *local_300;
  secp256k1_scalar *local_2f8;
  ulong local_2f0;
  uchar commit [32];
  long local_2c8;
  size_t local_2a0;
  int overflow;
  undefined4 uStack_28c;
  uint64_t uStack_288;
  uint64_t local_280;
  uint64_t uStack_278;
  void *local_270;
  long local_268;
  ulong local_260;
  long local_258;
  void *local_250;
  uchar vbuf [8];
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  long local_210;
  long local_208;
  long local_200;
  secp256k1_scalar mu;
  secp256k1_scalar taux;
  secp256k1_ge sge;
  secp256k1_gej r;
  uchar randomizer61 [32];
  secp256k1_ge age;
  
  bVar29 = 0;
  sVar5 = secp256k1_popcountl(nbits);
  iVar4 = 0;
  if ((((0xfffffffffffffbb8 < plen - 0x528) && (nbits < 0x41)) && (iVar4 = 0, sVar5 == 1)) &&
     (iVar3 = secp256k1_scratch_allocate_frame(scratch,n_proofs * 0x370,2), iVar3 != 0)) {
    local_308 = nbits;
    local_300 = (uint64_t *)secp256k1_scratch_alloc(scratch,n_proofs * 0x2f0);
    local_250 = secp256k1_scratch_alloc(scratch,n_proofs << 7);
    local_2f0 = CONCAT44(local_2f0._4_4_,1);
    psVar15 = value_gen;
    for (uVar26 = 1; uVar26 < n_proofs; uVar26 = uVar26 + 1) {
      iVar4 = secp256k1_fe_equal_var(&psVar15[1].x,&psVar15->x);
      if ((iVar4 == 0) || (iVar4 = secp256k1_fe_equal_var(&psVar15[1].y,&psVar15->y), iVar4 == 0)) {
        local_2f0 = local_2f0 & 0xffffffff00000000;
      }
      psVar15 = psVar15 + 1;
    }
    sVar5 = n_commits * local_308;
    local_258 = n_commits + 5;
    local_310 = scratch;
    local_2f8 = (secp256k1_scalar *)plen;
    for (sVar17 = 0; sVar17 != n_proofs; sVar17 = sVar17 + 1) {
      commit[0x10] = '\0';
      commit[0x11] = '\0';
      commit[0x12] = '\0';
      commit[0x13] = '\0';
      commit[0x14] = '\0';
      commit[0x15] = '\0';
      commit[0x16] = '\0';
      commit[0x17] = '\0';
      commit[0x18] = '\0';
      commit[0x19] = '\0';
      commit[0x1a] = '\0';
      commit[0x1b] = '\0';
      commit[0x1c] = '\0';
      commit[0x1d] = '\0';
      commit[0x1e] = '\0';
      commit[0x1f] = '\0';
      commit[0] = '\0';
      commit[1] = '\0';
      commit[2] = '\0';
      commit[3] = '\0';
      commit[4] = '\0';
      commit[5] = '\0';
      commit[6] = '\0';
      commit[7] = '\0';
      commit[8] = '\0';
      commit[9] = '\0';
      commit[10] = '\0';
      commit[0xb] = '\0';
      commit[0xc] = '\0';
      commit[0xd] = '\0';
      commit[0xe] = '\0';
      commit[0xf] = '\0';
      randomizer61[0x10] = '\0';
      randomizer61[0x11] = '\0';
      randomizer61[0x12] = '\0';
      randomizer61[0x13] = '\0';
      randomizer61[0x14] = '\0';
      randomizer61[0x15] = '\0';
      randomizer61[0x16] = '\0';
      randomizer61[0x17] = '\0';
      randomizer61[0x18] = '\0';
      randomizer61[0x19] = '\0';
      randomizer61[0x1a] = '\0';
      randomizer61[0x1b] = '\0';
      randomizer61[0x1c] = '\0';
      randomizer61[0x1d] = '\0';
      randomizer61[0x1e] = '\0';
      randomizer61[0x1f] = '\0';
      randomizer61[0] = '\0';
      randomizer61[1] = '\0';
      randomizer61[2] = '\0';
      randomizer61[3] = '\0';
      randomizer61[4] = '\0';
      randomizer61[5] = '\0';
      randomizer61[6] = '\0';
      randomizer61[7] = '\0';
      randomizer61[8] = '\0';
      randomizer61[9] = '\0';
      randomizer61[10] = '\0';
      randomizer61[0xb] = '\0';
      randomizer61[0xc] = '\0';
      randomizer61[0xd] = '\0';
      randomizer61[0xe] = '\0';
      randomizer61[0xf] = '\0';
      if ((min_value != (uint64_t **)0x0) && (min_value[sVar17] != (uint64_t *)0x0)) {
        r.x.n[0] = 0xbb67ae856a09e667;
        r.x.n[1] = 0xa54ff53a3c6ef372;
        r.x.n[2] = 0x9b05688c510e527f;
        r.x.n[3] = 0x5be0cd191f83d9ab;
        r.z.n[2] = 0;
        secp256k1_sha256_write((secp256k1_sha256 *)&r,commit,0x20);
        len = SUB84(n_commits,0);
        secp256k1_sha256_write((secp256k1_sha256 *)&r,len,4);
        for (sVar13 = 0; n_commits != sVar13; sVar13 = sVar13 + 1) {
          vbuf = *(uchar (*) [8])(min_value[sVar17] + sVar13);
          secp256k1_sha256_write((secp256k1_sha256 *)&r,vbuf,8);
        }
        secp256k1_sha256_finalize((secp256k1_sha256 *)&r,commit);
      }
      lVar21 = 0;
      sVar13 = n_commits;
      while (bVar28 = sVar13 != 0, sVar13 = sVar13 - 1, bVar28) {
        secp256k1_bulletproof_update_commit
                  (commit,(secp256k1_ge *)((long)(commitp[sVar17]->x).n + lVar21),value_gen + sVar17
                  );
        lVar21 = lVar21 + 0x58;
      }
      if ((extra_commit != (uchar **)0x0) && (extra_commit[sVar17] != (uchar *)0x0)) {
        r.x.n[0] = 0xbb67ae856a09e667;
        r.x.n[1] = 0xa54ff53a3c6ef372;
        r.x.n[2] = 0x9b05688c510e527f;
        r.x.n[3] = 0x5be0cd191f83d9ab;
        r.z.n[2] = 0;
        secp256k1_sha256_write((secp256k1_sha256 *)&r,commit,0x20);
        secp256k1_sha256_write((secp256k1_sha256 *)&r,extra_commit[sVar17],extra_commit_len[sVar17])
        ;
        secp256k1_sha256_finalize((secp256k1_sha256 *)&r,commit);
      }
      puVar23 = proof[sVar17];
      iVar4 = secp256k1_bulletproof_deserialize_point(&age,puVar23 + 0x40,0,4);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = secp256k1_bulletproof_deserialize_point(&sge,puVar23 + 0x40,1,4);
      if (iVar4 == 0) {
        return 0;
      }
      secp256k1_bulletproof_update_commit(commit,&age,&sge);
      puVar6 = local_300 + sVar17 * 0x5e + 0x3c;
      secp256k1_scalar_set_b32((secp256k1_scalar *)puVar6,commit,&overflow);
      if ((overflow != 0) ||
         (iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)puVar6), iVar4 != 0)) {
LAB_0010e05e:
        secp256k1_scratch_deallocate_frame(local_310);
        return 0;
      }
      r_00 = local_300 + sVar17 * 0x5e;
      secp256k1_bulletproof_update_commit(commit,&age,&sge);
      psVar7 = (secp256k1_scalar *)(r_00 + 8);
      secp256k1_scalar_set_b32(psVar7,commit,&overflow);
      if ((overflow != 0) || (iVar4 = secp256k1_scalar_is_zero(psVar7), iVar4 != 0))
      goto LAB_0010e05e;
      iVar4 = secp256k1_bulletproof_deserialize_point
                        ((secp256k1_ge *)(r_00 + 0x48),proof[sVar17] + 0x40,2,4);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = secp256k1_bulletproof_deserialize_point
                        ((secp256k1_ge *)(r_00 + 0x53),proof[sVar17] + 0x40,3,4);
      if (iVar4 == 0) {
        return 0;
      }
      secp256k1_bulletproof_update_commit
                (commit,(secp256k1_ge *)(r_00 + 0x48),(secp256k1_ge *)(r_00 + 0x53));
      secp256k1_scalar_set_b32((secp256k1_scalar *)(r_00 + 0x1c),commit,&overflow);
      if ((overflow != 0) ||
         (iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)(r_00 + 0x1c)), iVar4 != 0))
      goto LAB_0010e05e;
      secp256k1_scalar_inverse((secp256k1_scalar *)r_00,(secp256k1_scalar *)puVar6);
      r_00[6] = r_00[2];
      r_00[7] = r_00[3];
      r_00[4] = *r_00;
      r_00[5] = r_00[1];
      sVar13 = secp256k1_floor_lg(local_308);
      while (bVar28 = sVar13 != 0, sVar13 = sVar13 - 1, bVar28) {
        secp256k1_scalar_sqr((secp256k1_scalar *)(r_00 + 4),(secp256k1_scalar *)(r_00 + 4));
      }
      secp256k1_scalar_sqr((secp256k1_scalar *)(r_00 + 0x10),psVar7);
      secp256k1_scalar_negate((secp256k1_scalar *)(r_00 + 0x18),psVar7);
      r.x.n[0] = 0xbb67ae856a09e667;
      r.x.n[1] = 0xa54ff53a3c6ef372;
      r.x.n[2] = 0x9b05688c510e527f;
      r.x.n[3] = 0x5be0cd191f83d9ab;
      r.z.n[2] = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&r,commit,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&r,proof[sVar17],0x40);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&r,commit);
      r.x.n[0] = 0xbb67ae856a09e667;
      r.x.n[1] = 0xa54ff53a3c6ef372;
      r.x.n[2] = 0x9b05688c510e527f;
      r.x.n[3] = 0x5be0cd191f83d9ab;
      r.z.n[2] = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&r,commit,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&r,randomizer61);
      psVar7 = (secp256k1_scalar *)(r_00 + 0x38);
      secp256k1_scalar_set_b32(psVar7,randomizer61,&overflow);
      if ((overflow != 0) || (iVar4 = secp256k1_scalar_is_zero(psVar7), iVar4 != 0))
      goto LAB_0010e05e;
      puVar23 = proof[sVar17];
      secp256k1_scalar_set_b32(&taux,puVar23,&overflow);
      if ((overflow != 0) ||
         ((((taux.d[3] == 0 && taux.d[1] == 0) && (taux.d[2] == 0 && taux.d[0] == 0) ||
           (secp256k1_scalar_set_b32(&mu,puVar23 + 0x20,&overflow), overflow != 0)) ||
          ((mu.d[3] == 0 && mu.d[1] == 0) && (mu.d[2] == 0 && mu.d[0] == 0))))) goto LAB_0010e05e;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(r_00 + 0x40),puVar23 + 0xc1,&overflow);
      if ((overflow != 0) ||
         (iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)(r_00 + 0x40)), iVar4 != 0))
      goto LAB_0010e05e;
      lVar21 = 0xb;
      psVar15 = &age;
      puVar6 = r_00 + 0x20;
      for (lVar12 = lVar21; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar6 = (psVar15->x).n[0];
        psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar29 * -0x10 + 8);
        puVar6 = puVar6 + (ulong)bVar29 * -2 + 1;
      }
      psVar15 = &sge;
      puVar6 = r_00 + 0x2b;
      for (; lVar21 != 0; lVar21 = lVar21 + -1) {
        *puVar6 = (psVar15->x).n[0];
        psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar29 * -0x10 + 8);
        puVar6 = puVar6 + (ulong)bVar29 * -2 + 1;
      }
      r_00[0x37] = 0;
      r_00[0x36] = sVar5;
      r_00[0x44] = (uint64_t)(value_gen + sVar17);
      if (min_value == (uint64_t **)0x0) {
        puVar6 = (uint64_t *)0x0;
      }
      else {
        puVar6 = min_value[sVar17];
      }
      r_00[0x46] = (uint64_t)puVar6;
      r_00[0x45] = (uint64_t)commitp[sVar17];
      r_00[0x47] = n_commits;
      secp256k1_scalar_mul(&taux,&taux,psVar7);
      secp256k1_scalar_add(&mu,&mu,&taux);
      lVar21 = sVar17 * 0x80;
      *(uchar **)((long)local_250 + lVar21) = proof[sVar17] + 0xc1;
      puVar6 = (uint64_t *)((long)local_250 + lVar21 + 0x18);
      *puVar6 = mu.d[2];
      puVar6[1] = mu.d[3];
      puVar6 = (uint64_t *)((long)local_250 + lVar21 + 8);
      *puVar6 = mu.d[0];
      puVar6[1] = mu.d[1];
      puVar23 = (uchar *)((long)local_250 + lVar21 + 0x48);
      *(undefined8 *)puVar23 = commit._0_8_;
      *(undefined8 *)(puVar23 + 8) = commit._8_8_;
      puVar23 = (uchar *)((long)local_250 + lVar21 + 0x58);
      *(undefined8 *)puVar23 = commit._16_8_;
      *(undefined8 *)(puVar23 + 8) = commit._24_8_;
      uVar16 = *r_00;
      uVar1 = r_00[1];
      uVar2 = r_00[3];
      puVar6 = (uint64_t *)((long)local_250 + lVar21 + 0x38);
      *puVar6 = r_00[2];
      puVar6[1] = uVar2;
      puVar6 = (uint64_t *)((long)local_250 + lVar21 + 0x28);
      *puVar6 = uVar16;
      puVar6[1] = uVar1;
      *(code **)((long)local_250 + lVar21 + 0x68) = secp256k1_bulletproof_rangeproof_vfy_callback;
      *(uint64_t **)((long)local_250 + lVar21 + 0x70) = r_00;
      *(long *)((long)local_250 + lVar21 + 0x78) = local_258;
    }
    psVar22 = (secp256k1_scalar *)((long)local_2f8 - 0xc1);
    bVar28 = (int)local_2f0 != 0;
    psVar7 = (secp256k1_scalar *)secp256k1_bulletproof_innerproduct_proof_length(sVar5);
    scratch_00 = local_310;
    iVar4 = 0;
    local_2f8 = psVar22;
    if (psVar7 == psVar22) {
      if (n_proofs == 0) {
        iVar4 = 1;
      }
      else {
        iVar3 = secp256k1_scratch_allocate_frame(local_310,n_proofs * 0x10d0,2);
        iVar4 = 0;
        if (iVar3 != 0) {
          local_308 = sVar5 * 2;
          local_2a0 = (ulong)bVar28 + sVar5 * 2 + 1;
          local_258 = -(ulong)bVar28;
          sge.y.n[0] = (uint64_t)gens->blinding_gen;
          sge.y.n[1] = (uint64_t)gens->gens;
          sge.y.n[2] = sge.y.n[1] + (gens->n >> 1) * 0x58;
          sge.x.n[0] = n_proofs;
          sge.y.n[3] = sVar5;
          sge.y.n[4] = secp256k1_floor_lg(local_308 >> 2);
          sge.infinity = (int)local_2f0;
          pvVar8 = secp256k1_scratch_alloc(scratch_00,n_proofs << 5);
          pvVar9 = secp256k1_scratch_alloc(scratch_00,n_proofs * 0x10b0);
          age.x.n[0] = 0xbb67ae856a09e667;
          age.x.n[1] = 0xa54ff53a3c6ef372;
          age.x.n[2] = 0x9b05688c510e527f;
          age.x.n[3] = 0x5be0cd191f83d9ab;
          puVar23 = (uchar *)((long)local_250 + 0x48);
          sVar17 = n_proofs;
          while (bVar28 = sVar17 != 0, sVar17 = sVar17 - 1, bVar28) {
            secp256k1_sha256_write
                      ((secp256k1_sha256 *)&age,*(uchar **)(puVar23 + -0x48),(size_t)local_2f8);
            secp256k1_sha256_write((secp256k1_sha256 *)&age,puVar23,0x20);
            secp256k1_scalar_get_b32(randomizer61,(secp256k1_scalar *)(puVar23 + -0x40));
            secp256k1_sha256_write((secp256k1_sha256 *)&age,randomizer61,0x20);
            puVar23 = puVar23 + 0x80;
          }
          secp256k1_sha256_finalize((secp256k1_sha256 *)&age,randomizer61);
          sge.x.n[3] = 0;
          sge.x.n[4] = 0;
          sge.x.n[1] = 0;
          sge.x.n[2] = 0;
          local_2f0 = 4;
          if (local_308 < 4) {
            local_2f0 = local_308;
          }
          n = local_2f0 >> 1 & 0x7fffffff;
          local_2f8 = (secp256k1_scalar *)((long)r.x.n + (ulong)(uint)((int)n << 5));
          uVar26 = local_2f0 - 1;
          lVar21 = local_2f0 * 0x20;
          local_300 = r.x.n + local_2f0 * 4 + -4;
          uVar27 = (ulong)(uint)((int)local_2f0 << 5);
          psVar7 = (secp256k1_scalar *)((long)sge.y.n + uVar27 + 0x20);
          local_208 = uVar27 - 0x18;
          local_200 = uVar27 - 0x38;
          local_2c8 = 0x88;
          local_210 = 0x28;
          local_260 = uVar26;
          for (sVar17 = 0; uVar16 = sge.y.n[4], pvVar20 = local_250, scratch_00 = local_310,
              sVar17 != n_proofs; sVar17 = sVar17 + 1) {
            lVar19 = sVar17 * 0x80;
            puVar23 = *(uchar **)((long)local_250 + lVar19);
            lVar10 = local_2a0 + local_258;
            lVar12 = *(long *)((long)local_250 + lVar19 + 0x78);
            secp256k1_scalar_set_b32(&mu,puVar23,(int *)len);
            if (len != (uchar  [4])0x0) {
LAB_0010ea3f:
              secp256k1_scratch_deallocate_frame(scratch_00);
              iVar4 = 0;
              goto LAB_0010ea49;
            }
            pvVar20 = (void *)(lVar19 + (long)pvVar20);
            local_2a0 = lVar10 + lVar12 + uVar16 * 2;
            age.x.n[0] = 0xbb67ae856a09e667;
            age.x.n[1] = 0xa54ff53a3c6ef372;
            age.x.n[2] = 0x9b05688c510e527f;
            age.x.n[3] = 0x5be0cd191f83d9ab;
            secp256k1_sha256_write((secp256k1_sha256 *)&age,(uchar *)((long)pvVar20 + 0x48),0x20);
            secp256k1_sha256_write((secp256k1_sha256 *)&age,puVar23,0x20);
            secp256k1_sha256_finalize((secp256k1_sha256 *)&age,(uchar *)&taux);
            puVar14 = puVar23 + 0x40;
            uVar27 = 0;
            puVar18 = puVar23;
            while( true ) {
              puVar18 = puVar18 + 0x20;
              puVar23 = puVar23 + 0x20;
              if (uVar27 == local_2f0) break;
              puVar6 = r.x.n + uVar27 * 4;
              secp256k1_scalar_set_b32((secp256k1_scalar *)puVar6,puVar23,(int *)len);
              scratch_00 = local_310;
              if (len != (uchar  [4])0x0) goto LAB_0010ea3f;
              iVar4 = secp256k1_scalar_is_zero((secp256k1_scalar *)puVar6);
              uVar27 = uVar27 + 1;
              puVar14 = puVar14 + 0x20;
              scratch_00 = local_310;
              if (iVar4 != 0) goto LAB_0010ea3f;
            }
            secp256k1_scalar_dot_product
                      ((secp256k1_scalar *)vbuf,(secp256k1_scalar *)&r,local_2f8,n);
            local_268 = sVar17 * 0x10b0;
            *(void **)((long)pvVar9 + local_268) = pvVar20;
            age.x.n[0] = 0xbb67ae856a09e667;
            age.x.n[1] = 0xa54ff53a3c6ef372;
            age.x.n[2] = 0x9b05688c510e527f;
            age.x.n[3] = 0x5be0cd191f83d9ab;
            secp256k1_sha256_write((secp256k1_sha256 *)&age,randomizer61,0x20);
            secp256k1_sha256_finalize((secp256k1_sha256 *)&age,randomizer61);
            lVar12 = sVar17 * 0x20;
            psVar22 = (secp256k1_scalar *)((long)pvVar8 + lVar12);
            secp256k1_scalar_set_b32(psVar22,randomizer61,(int *)len);
            scratch_00 = local_310;
            if (((len != (uchar  [4])0x0) ||
                (iVar4 = secp256k1_scalar_is_zero(psVar22), scratch_00 = local_310, iVar4 != 0)) ||
               ((secp256k1_scalar_set_b32((secp256k1_scalar *)&overflow,(uchar *)&taux,(int *)len),
                scratch_00 = local_310, len != (uchar  [4])0x0 ||
                ((uStack_278 == 0 && uStack_288 == 0) &&
                 (local_280 == 0 && CONCAT44(uStack_28c,overflow) == 0))))) goto LAB_0010ea3f;
            secp256k1_scalar_negate((secp256k1_scalar *)vbuf,(secp256k1_scalar *)vbuf);
            secp256k1_scalar_add((secp256k1_scalar *)vbuf,(secp256k1_scalar *)vbuf,&mu);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)&overflow,(secp256k1_scalar *)&overflow,
                       (secp256k1_scalar *)vbuf);
            secp256k1_scalar_add
                      ((secp256k1_scalar *)&overflow,(secp256k1_scalar *)&overflow,
                       (secp256k1_scalar *)((long)pvVar20 + 8));
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)&overflow,(secp256k1_scalar *)&overflow,psVar22);
            puVar6 = sge.x.n + 1;
            iVar4 = secp256k1_scalar_add
                              ((secp256k1_scalar *)puVar6,(secp256k1_scalar *)puVar6,
                               (secp256k1_scalar *)&overflow);
            if (local_308 < 5) {
              auVar30._0_4_ = -(uint)((int)local_238 == 0 && vbuf._0_4_ == 0);
              auVar30._4_4_ = -(uint)(local_238._4_4_ == 0 && vbuf._4_4_ == 0);
              auVar30._8_4_ = -(uint)((int)uStack_230 == 0 && (int)uStack_240 == 0);
              auVar30._12_4_ = -(uint)(uStack_230._4_4_ == 0 && uStack_240._4_4_ == 0);
              iVar4 = movmskps(iVar4,auVar30);
              scratch_00 = local_310;
              if (iVar4 != 0xf) goto LAB_0010ea3f;
              if (sVar5 != 0) goto LAB_0010e617;
            }
            else {
LAB_0010e617:
              *(uchar **)((long)pvVar9 + local_268 + 0x10a8) = puVar23;
              vbuf = (uchar  [8])*local_300;
              uStack_240 = local_300[1];
              local_238 = local_300[2];
              uStack_230 = local_300[3];
              uVar16 = *(uint64_t *)((long)pvVar8 + lVar12);
              uVar1 = ((uint64_t *)((long)pvVar8 + lVar12))[1];
              puVar6 = (uint64_t *)((long)pvVar8 + lVar12 + 0x10);
              uVar2 = puVar6[1];
              local_300[2] = *puVar6;
              local_300[3] = uVar2;
              *local_300 = uVar16;
              local_300[1] = uVar1;
              uVar27 = sge.y.n[4] * 2 + 7 >> 3;
              psVar22 = (secp256k1_scalar *)((long)pvVar9 + local_2c8);
              puVar18 = puVar18 + uVar27;
              puVar14 = puVar14 + uVar27;
              uVar27 = 0;
              uVar16 = sge.y.n[4];
              local_270 = pvVar9;
              while (lVar10 = local_268, pvVar20 = local_270, bVar28 = uVar16 != 0,
                    uVar16 = uVar16 - 1, bVar28) {
                local_311 = (puVar23[uVar27 >> 3] >> ((int)uVar27 + 1U & 7) & 1) != 0 |
                            (puVar23[uVar27 >> 3] >> ((byte)uVar27 & 6)) * '\x02' & 2;
                age.x.n[0] = 0xbb67ae856a09e667;
                age.x.n[1] = 0xa54ff53a3c6ef372;
                age.x.n[2] = 0x9b05688c510e527f;
                age.x.n[3] = 0x5be0cd191f83d9ab;
                secp256k1_sha256_write((secp256k1_sha256 *)&age,(uchar *)&taux,0x20);
                secp256k1_sha256_write((secp256k1_sha256 *)&age,&local_311,1);
                secp256k1_sha256_write((secp256k1_sha256 *)&age,puVar18,0x20);
                secp256k1_sha256_write((secp256k1_sha256 *)&age,puVar14,0x20);
                secp256k1_sha256_finalize((secp256k1_sha256 *)&age,(uchar *)&taux);
                secp256k1_scalar_set_b32((secp256k1_scalar *)commit,(uchar *)&taux,(int *)len);
                scratch_00 = local_310;
                if (len != (uchar  [4])0x0) goto LAB_0010ea3f;
                if ((commit._24_8_ == 0 && commit._8_8_ == 0) &&
                    (commit._16_8_ == 0 && commit._0_8_ == 0)) goto LAB_0010ea3f;
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)local_300,(secp256k1_scalar *)local_300,
                           (secp256k1_scalar *)commit);
                secp256k1_scalar_sqr(psVar22,(secp256k1_scalar *)commit);
                psVar22 = psVar22 + 1;
                puVar18 = puVar18 + 0x40;
                uVar27 = uVar27 + 2;
                puVar14 = puVar14 + 0x40;
              }
              psVar22 = (secp256k1_scalar *)((long)local_270 + local_268 + 8);
              if (local_308 != 0) {
                *(uint64_t *)((long)local_270 + local_268 + 0x18) = r.x.n[2];
                *(uint64_t *)((long)local_270 + local_268 + 0x20) = r.x.n[3];
                psVar22->d[0] = r.x.n[0];
                *(uint64_t *)((long)local_270 + local_268 + 0x10) = r.x.n[1];
                psVar24 = (secp256k1_scalar *)((long)local_270 + local_210);
                puVar6 = r.x.n;
                uVar27 = local_260;
                while( true ) {
                  puVar6 = puVar6 + 4;
                  bVar28 = uVar27 == 0;
                  uVar27 = uVar27 - 1;
                  if (bVar28) break;
                  secp256k1_scalar_mul(psVar24,psVar24 + -1,(secp256k1_scalar *)puVar6);
                  psVar24 = psVar24 + 1;
                }
                secp256k1_scalar_inverse((secp256k1_scalar *)commit,psVar22 + uVar26);
                psVar24 = (secp256k1_scalar *)((long)local_270 + local_208);
                uVar27 = local_260;
                psVar25 = psVar7;
                while (bVar28 = uVar27 != 0, uVar27 = uVar27 - 1, bVar28) {
                  secp256k1_scalar_mul(psVar24,psVar24 + -1,(secp256k1_scalar *)commit);
                  secp256k1_scalar_mul
                            ((secp256k1_scalar *)commit,(secp256k1_scalar *)commit,psVar25);
                  psVar25 = psVar25 + -1;
                  psVar24 = psVar24 + -1;
                }
                *(undefined8 *)((long)pvVar20 + lVar10 + 0x18) = commit._16_8_;
                *(undefined8 *)((long)pvVar20 + lVar10 + 0x20) = commit._24_8_;
                psVar22->d[0] = commit._0_8_;
                *(undefined8 *)((long)pvVar20 + lVar10 + 0x10) = commit._8_8_;
              }
              lVar10 = local_268;
              pvVar20 = local_270;
              local_300[2] = local_238;
              local_300[3] = uStack_230;
              *local_300 = (uint64_t)vbuf;
              local_300[1] = uStack_240;
              psVar24 = (secp256k1_scalar *)((long)local_270 + local_268 + 0x1088);
              secp256k1_scalar_negate(psVar24,psVar22);
              secp256k1_scalar_mul
                        (psVar24,psVar24,
                         (secp256k1_scalar *)((long)pvVar20 + lVar21 + lVar10 + -0x18));
              psVar25 = (secp256k1_scalar *)((long)pvVar20 + local_200);
              psVar22 = psVar7;
              uVar27 = local_260;
              while (uVar27 != 0) {
                uVar11 = uVar27;
                if (n == uVar27) {
                  uVar11 = 0xffffffffffffffff;
                }
                secp256k1_scalar_mul
                          (psVar25,(secp256k1_scalar *)
                                   ((long)pvVar20 + (uVar11 & uVar27 - 1) * 0x20 + lVar10 + 8),
                           psVar22);
                psVar22 = psVar22 + -1;
                psVar25 = psVar25 + -1;
                uVar27 = uVar27 - 1;
              }
              secp256k1_scalar_mul
                        ((secp256k1_scalar *)vbuf,(secp256k1_scalar *)((long)pvVar8 + lVar12),
                         (secp256k1_scalar *)&r);
              secp256k1_scalar_sqr((secp256k1_scalar *)vbuf,(secp256k1_scalar *)vbuf);
              secp256k1_scalar_mul
                        ((secp256k1_scalar *)((long)pvVar20 + lVar10 + 0xc88),psVar24,
                         (secp256k1_scalar *)vbuf);
            }
            local_2c8 = local_2c8 + 0x10b0;
            local_210 = local_210 + 0x10b0;
            local_208 = local_208 + 0x10b0;
            local_200 = local_200 + 0x10b0;
          }
          iVar3 = secp256k1_ecmult_multi_var
                            (ecmult_ctx,local_310,&r,(secp256k1_scalar *)0x0,
                             secp256k1_bulletproof_innerproduct_vfy_ecmult_callback,&sge,local_2a0);
          secp256k1_scratch_deallocate_frame(scratch_00);
          iVar4 = 0;
          if (iVar3 == 1) {
            iVar4 = r.infinity;
          }
        }
      }
    }
LAB_0010ea49:
    secp256k1_scratch_deallocate_frame(scratch_00);
  }
  return iVar4;
}

Assistant:

static int secp256k1_bulletproof_rangeproof_verify_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, const unsigned char* const* proof, const size_t n_proofs, const size_t plen, size_t nbits, const uint64_t* const* min_value, const secp256k1_ge* const* commitp, size_t n_commits, const secp256k1_ge *value_gen, const secp256k1_bulletproof_generators *gens, const unsigned char* const* extra_commit, size_t *extra_commit_len) {
    secp256k1_bulletproof_vfy_ecmult_context *ecmult_data;
    secp256k1_bulletproof_innerproduct_context *innp_ctx;
    int ret;
    size_t i;
    int same_generators = 1;

    /* sanity-check input */
    if (secp256k1_popcountl(nbits) != 1 || nbits > MAX_NBITS) {
        return 0;
    }
    if (plen < 64 + 128 + 1 + 32) {  /* inner product argument will do a more precise check */
        return 0;
    }
    if (plen > SECP256K1_BULLETPROOF_MAX_PROOF) {
        return 0;
    }

    if (!secp256k1_scratch_allocate_frame(scratch, n_proofs * (sizeof(*ecmult_data) + sizeof(*innp_ctx)), 2)) {
        return 0;
    }
    ecmult_data = (secp256k1_bulletproof_vfy_ecmult_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*ecmult_data));
    innp_ctx = (secp256k1_bulletproof_innerproduct_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*innp_ctx));

    /* Check if all generators are equal. If so, we can amortize all their scalar multiplications
     * by them and save one scalar-ge multiplication per proof. */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[0]));
    for (i = 1; i < n_proofs; i++) {
        VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[i]));
        if (!secp256k1_fe_equal_var(&value_gen[i].x, &value_gen[i - 1].x) ||
            !secp256k1_fe_equal_var(&value_gen[i].y, &value_gen[i - 1].y)) {
            same_generators = 0;
        }
    }

    for (i = 0; i < n_proofs; i++) {
        secp256k1_sha256 sha256;
        unsigned char commit[32] = {0};
        unsigned char randomizer61[32] = {0};  /* randomizer for eq (61) so we can add it to eq (62) to save a separate multiexp */
        secp256k1_scalar taux, mu;
        secp256k1_ge age, sge;
        int overflow;
        size_t j;

        /* Commit to all input data: min value, pedersen commit, asset generator, extra_commit */
        if (min_value != NULL && min_value[i] != NULL) {
            unsigned char len[4];
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            len[0] = n_commits;
            len[1] = n_commits >> 8;
            len[2] = n_commits >> 16;
            len[3] = n_commits >> 24;
            secp256k1_sha256_write(&sha256, len, 4);
            for (j = 0; j < n_commits; j++) {
                unsigned char vbuf[8];
                vbuf[0] = min_value[i][j];
                vbuf[1] = min_value[i][j] >> 8;
                vbuf[2] = min_value[i][j] >> 16;
                vbuf[3] = min_value[i][j] >> 24;
                vbuf[4] = min_value[i][j] >> 32;
                vbuf[5] = min_value[i][j] >> 40;
                vbuf[6] = min_value[i][j] >> 48;
                vbuf[7] = min_value[i][j] >> 56;
                secp256k1_sha256_write(&sha256, vbuf, 8);
            }
            secp256k1_sha256_finalize(&sha256, commit);
        }
        for (j = 0; j < n_commits; j++) {
            secp256k1_bulletproof_update_commit(commit, &commitp[i][j], &value_gen[i]);
        }
        if (extra_commit != NULL && extra_commit[i] != NULL) {
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            secp256k1_sha256_write(&sha256, extra_commit[i], extra_commit_len[i]);
            secp256k1_sha256_finalize(&sha256, commit);
        }

        /* Compute y, z, x */
        if (!secp256k1_bulletproof_deserialize_point(&age, &proof[i][64], 0, 4) ||
            !secp256k1_bulletproof_deserialize_point(&sge, &proof[i][64], 1, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].y, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].y)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].z, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].z)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        if (!secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t1, &proof[i][64], 2, 4) ||
            !secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t2, &proof[i][64], 3, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &ecmult_data[i].t1, &ecmult_data[i].t2);
        secp256k1_scalar_set_b32(&ecmult_data[i].x, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].x)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* compute exponent offsets */
        secp256k1_scalar_inverse_var(&ecmult_data[i].yinv, &ecmult_data[i].y);  /* TODO somehow batch this w the inner-product argument inverse */
        ecmult_data[i].yinvn = ecmult_data[i].yinv;
        for (j = 0; j < secp256k1_floor_lg(nbits); j++) {
            secp256k1_scalar_sqr(&ecmult_data[i].yinvn, &ecmult_data[i].yinvn);
        }
        secp256k1_scalar_sqr(&ecmult_data[i].zsq, &ecmult_data[i].z);
        secp256k1_scalar_negate(&ecmult_data[i].negz, &ecmult_data[i].z);

        /* Update commit with remaining data for the inner product proof */
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_write(&sha256, &proof[i][0], 64);
        secp256k1_sha256_finalize(&sha256, commit);

        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_finalize(&sha256, randomizer61);
        secp256k1_scalar_set_b32(&ecmult_data[i].randomizer61, randomizer61, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].randomizer61)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Deserialize everything else */
        secp256k1_scalar_set_b32(&taux, &proof[i][0], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&taux)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_scalar_set_b32(&mu, &proof[i][32], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&mu)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        /* A little sketchy, we read t (l(x) . r(x)) off the front of the inner product proof,
         * which we otherwise treat as a black box */
        secp256k1_scalar_set_b32(&ecmult_data[i].t, &proof[i][64 + 128 + 1], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].t)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Verify inner product proof */
        ecmult_data[i].a = age;
        ecmult_data[i].s = sge;
        ecmult_data[i].n = nbits * n_commits;
        ecmult_data[i].count = 0;
        ecmult_data[i].asset = &value_gen[i];
        ecmult_data[i].min_value = min_value == NULL ? NULL : min_value[i];
        ecmult_data[i].commit = commitp[i];
        ecmult_data[i].n_commits = n_commits;
        secp256k1_scalar_mul(&taux, &taux, &ecmult_data[i].randomizer61);
        secp256k1_scalar_add(&mu, &mu, &taux);

        innp_ctx[i].proof = &proof[i][64 + 128 + 1];
        innp_ctx[i].p_offs = mu;
        memcpy(innp_ctx[i].commit, commit, 32);
        innp_ctx[i].yinv = ecmult_data[i].yinv;
        innp_ctx[i].rangeproof_cb = secp256k1_bulletproof_rangeproof_vfy_callback;
        innp_ctx[i].rangeproof_cb_data = (void *) &ecmult_data[i];
        innp_ctx[i].n_extra_rangeproof_points = 5 + n_commits;
    }

    ret = secp256k1_bulletproof_inner_product_verify_impl(ecmult_ctx, scratch, gens, nbits * n_commits, innp_ctx, n_proofs, plen - (64 + 128 + 1), same_generators);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}